

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::UsesTypeFromFile
               (Descriptor *message,FileDescriptor *file,string *error)

{
  bool bVar1;
  int iVar2;
  CppType CVar3;
  Type TVar4;
  int iVar5;
  Descriptor *pDVar6;
  string *psVar7;
  EnumDescriptor *this;
  int local_108;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  FieldDescriptor *local_38;
  FieldDescriptor *field;
  string *psStack_28;
  int i;
  string *error_local;
  FileDescriptor *file_local;
  Descriptor *message_local;
  
  field._4_4_ = 0;
  psStack_28 = error;
  error_local = (string *)file;
  file_local = (FileDescriptor *)message;
  do {
    iVar5 = field._4_4_;
    iVar2 = Descriptor::field_count((Descriptor *)file_local);
    if (iVar2 <= iVar5) {
      local_108 = 0;
      while( true ) {
        iVar5 = Descriptor::nested_type_count((Descriptor *)file_local);
        if (iVar5 <= local_108) {
          return false;
        }
        pDVar6 = Descriptor::nested_type((Descriptor *)file_local,local_108);
        bVar1 = UsesTypeFromFile(pDVar6,(FileDescriptor *)error_local,psStack_28);
        if (bVar1) break;
        local_108 = local_108 + 1;
      }
      return true;
    }
    local_38 = Descriptor::field((Descriptor *)file_local,field._4_4_);
    CVar3 = FieldDescriptor::cpp_type(local_38);
    if (CVar3 == CPPTYPE_MESSAGE) {
      pDVar6 = FieldDescriptor::message_type(local_38);
      psVar7 = (string *)Descriptor::file(pDVar6);
      if (psVar7 == error_local) goto LAB_003d6d62;
    }
    TVar4 = FieldDescriptor::type(local_38);
    if (TVar4 == TYPE_ENUM) {
      this = FieldDescriptor::enum_type(local_38);
      psVar7 = (string *)EnumDescriptor::file(this);
      if (psVar7 == error_local) {
LAB_003d6d62:
        psVar7 = FieldDescriptor::full_name_abi_cxx11_(local_38);
        std::operator+(&local_f8,"proto3 message field ",psVar7);
        std::operator+(&local_d8,&local_f8," in file ");
        psVar7 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)error_local);
        std::operator+(&local_b8,&local_d8,psVar7);
        std::operator+(&local_98,&local_b8," has a dependency on a type from proto2 file ");
        psVar7 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)error_local);
        std::operator+(&local_78,&local_98,psVar7);
        std::operator+(&local_58,&local_78,".  Ruby doesn\'t support proto2 yet, so we must fail.");
        std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        return true;
      }
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

bool UsesTypeFromFile(const Descriptor* message, const FileDescriptor* file,
                      string* error) {
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if ((field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
         field->message_type()->file() == file) ||
        (field->type() == FieldDescriptor::TYPE_ENUM &&
         field->enum_type()->file() == file)) {
      *error = "proto3 message field " + field->full_name() + " in file " +
               file->name() + " has a dependency on a type from proto2 file " +
               file->name() +
               ".  Ruby doesn't support proto2 yet, so we must fail.";
      return true;
    }
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (UsesTypeFromFile(message->nested_type(i), file, error)) {
      return true;
    }
  }

  return false;
}